

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::scatterv_recv<std::tuple<int,int,int>>
               (tuple<int,_int,_int> *out,size_t recv_size,int root,comm *comm)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scatterv<std::tuple<int,int,int>>
            ((tuple<int,_int,_int> *)0x0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,out,recv_size,root,
             comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void scatterv_recv(T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    scatterv((const T*) nullptr, std::vector<size_t>(), out, recv_size, root, comm);
}